

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cc
# Opt level: O0

void runOnce<long,disruptor::SingleThreadedStrategy,disruptor::BusySpinStrategy>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ostream *poVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  rep rVar8;
  ulong uVar9;
  type diff;
  time_point end_time;
  int64_t cursor;
  int i_4;
  int i_3;
  int i_2;
  time_point start_time;
  thread *tp;
  int i_1;
  thread *tc;
  int i;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0> s;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> seqs;
  Sequence *sequences;
  memory_order __b_1;
  memory_order __b;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>
  *in_stack_fffffffffffffc48;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>
  *in_stack_fffffffffffffc50;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0> *this;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_fffffffffffffc58;
  ulong *puVar10;
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *in_stack_fffffffffffffc60;
  size_t in_stack_fffffffffffffc68;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>
  *in_stack_fffffffffffffc70;
  ulong *puVar11;
  reference_wrapper<disruptor::Sequence> *in_stack_fffffffffffffc78;
  ulong *puVar12;
  reference_wrapper<disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>_>
  *in_stack_fffffffffffffc80;
  _func_void_Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>_ptr_Sequence_ptr
  *in_stack_fffffffffffffc88;
  thread *in_stack_fffffffffffffc90;
  char *in_stack_fffffffffffffca8;
  ulong *local_288;
  ulong *local_258;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0> *local_228;
  duration<long,_std::ratio<1L,_1000L>_> local_200;
  string local_1f8 [32];
  string local_1d8 [32];
  rep local_1b8;
  undefined8 local_1b0;
  int64_t local_1a8;
  int local_1a0;
  int local_19c;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0> *local_198;
  int local_184;
  undefined8 local_180;
  ulong *local_178;
  Sequence *local_170;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0> *local_168;
  int local_154;
  ulong *local_150;
  int64_t *local_148;
  int local_13c;
  Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0> *local_40;
  __atomic_base<long> local_38;
  memory_order local_30;
  undefined4 local_2c;
  atomic<long> *local_28;
  __int_type local_20;
  memory_order local_18;
  int local_14;
  __atomic_base<long> local_10;
  atomic<long> *local_8;
  
  poVar4 = std::operator<<((ostream *)&std::cout,"Staring run ");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_8 = &sum;
  local_10._M_i = 0;
  local_14 = 5;
  local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_20 = local_10._M_i;
  if ((local_14 != 3) && (local_14 == 5)) {
    LOCK();
    UNLOCK();
  }
  sum.super___atomic_base<long>._M_i = (__atomic_base<long>)(__atomic_base<long>)local_10._M_i;
  uVar5 = (ulong)nc;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar5;
  uVar6 = SUB168(auVar1 * ZEXT816(0x78),0);
  if (SUB168(auVar1 * ZEXT816(0x78),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  local_40 = (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0> *)
             operator_new__(uVar6);
  if (uVar5 != 0) {
    local_228 = local_40;
    do {
      disruptor::Sequence::Sequence
                ((Sequence *)in_stack_fffffffffffffc50,(int64_t)in_stack_fffffffffffffc48);
      local_228 = (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>
                   *)((local_228->cursor_).padding1_ + 3);
    } while (local_228 !=
             (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0> *)
             ((&local_40->cursor_)[uVar5 - 1].padding1_ + 3));
  }
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::vector
            ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)0x1647c6);
  disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>::
  Sequencer(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
  for (local_13c = 0; local_13c < nc; local_13c = local_13c + 1) {
    local_148 = (&local_40->cursor_)[(long)local_13c + -1].padding1_ + 3;
    std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::push_back
              ((vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
               in_stack_fffffffffffffc50,(value_type *)in_stack_fffffffffffffc48);
  }
  disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>::
  set_gating_sequences
            (in_stack_fffffffffffffc50,
             (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)
             in_stack_fffffffffffffc48);
  uVar5 = (ulong)nc;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar5;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  uVar9 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_150 = (ulong *)operator_new__(uVar9);
  *local_150 = uVar5;
  local_150 = local_150 + 1;
  if (uVar5 != 0) {
    local_258 = local_150;
    do {
      std::thread::thread((thread *)0x164959);
      local_258 = local_258 + 1;
    } while (local_258 != local_150 + uVar5);
  }
  for (local_154 = 0; local_154 < nc; local_154 = local_154 + 1) {
    local_168 = (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>
                 *)std::
                   ref<disruptor::Sequencer<long,disruptor::SingleThreadedStrategy,disruptor::BusySpinStrategy,0>>
                             (in_stack_fffffffffffffc48);
    local_170 = (Sequence *)std::ref<disruptor::Sequence>((Sequence *)in_stack_fffffffffffffc48);
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::SingleThreadedStrategy,disruptor::BusySpinStrategy,0>&,disruptor::Sequence&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::SingleThreadedStrategy,disruptor::BusySpinStrategy,0>>,std::reference_wrapper<disruptor::Sequence>,void>
              (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
               in_stack_fffffffffffffc78);
    std::thread::operator=((thread *)in_stack_fffffffffffffc50,(thread *)in_stack_fffffffffffffc48);
    std::thread::~thread((thread *)0x164a38);
  }
  uVar5 = (ulong)np;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar5;
  uVar6 = SUB168(auVar3 * ZEXT816(8),0);
  uVar9 = uVar6 + 8;
  if (0xfffffffffffffff7 < uVar6) {
    uVar9 = 0xffffffffffffffff;
  }
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  local_178 = (ulong *)operator_new__(uVar9);
  *local_178 = uVar5;
  local_178 = local_178 + 1;
  if (uVar5 != 0) {
    local_288 = local_178;
    do {
      std::thread::thread((thread *)0x164af3);
      local_288 = local_288 + 1;
    } while (local_288 != local_178 + uVar5);
  }
  local_180 = std::chrono::_V2::system_clock::now();
  for (local_184 = 0; local_184 < np; local_184 = local_184 + 1) {
    local_198 = (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>
                 *)std::
                   ref<disruptor::Sequencer<long,disruptor::SingleThreadedStrategy,disruptor::BusySpinStrategy,0>>
                             (in_stack_fffffffffffffc48);
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::SingleThreadedStrategy,disruptor::BusySpinStrategy,0>&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::SingleThreadedStrategy,disruptor::BusySpinStrategy,0>>,void>
              (in_stack_fffffffffffffc90,
               (_func_void_Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>_ptr
                *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80);
    std::thread::operator=((thread *)in_stack_fffffffffffffc50,(thread *)in_stack_fffffffffffffc48);
    std::thread::~thread((thread *)0x164baf);
  }
  for (local_19c = 0; local_19c < np; local_19c = local_19c + 1) {
    std::thread::join();
  }
  for (local_1a0 = 0; local_1a0 < nc; local_1a0 = local_1a0 + 1) {
    std::thread::join();
  }
  local_1a8 = disruptor::
              Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>::
              GetCursor((Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>
                         *)0x164c66);
  poVar4 = std::operator<<((ostream *)&std::cout,"\nBatch size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,delta);
  poVar4 = std::operator<<(poVar4," Ring buffer size: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,RING_BUFFER_SIZE);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Cursor: ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_1a8);
  std::operator<<(poVar4,'\n');
  poVar4 = std::operator<<((ostream *)&std::cout,"Sum: ");
  local_28 = &sum;
  local_2c = 5;
  local_30 = std::operator&(memory_order_seq_cst,__memory_order_mask);
  local_38 = sum.super___atomic_base<long>._M_i;
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(long)sum.super___atomic_base<long>._M_i);
  poVar4 = std::operator<<(poVar4," Expected sum: ");
  poVar4 = (ostream *)
           std::ostream::operator<<(poVar4,(expectedValue * (expectedValue + 1) * (long)nc) / 2);
  std::operator<<(poVar4,'\n');
  local_1b0 = std::chrono::_V2::system_clock::now();
  local_1b8 = (rep)std::chrono::operator-
                             (in_stack_fffffffffffffc58,
                              (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                               *)in_stack_fffffffffffffc50);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,np);
  poVar4 = std::operator<<(poVar4,"P-");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,nc);
  poVar4 = std::operator<<(poVar4,"C ");
  std::type_info::name((type_info *)&disruptor::SingleThreadedStrategy::typeinfo);
  demangle_abi_cxx11_(in_stack_fffffffffffffca8);
  poVar4 = std::operator<<(poVar4,local_1d8);
  poVar4 = std::operator<<(poVar4," ");
  std::type_info::name((type_info *)&disruptor::BusySpinStrategy::typeinfo);
  demangle_abi_cxx11_(in_stack_fffffffffffffca8);
  poVar4 = std::operator<<(poVar4,local_1f8);
  std::operator<<(poVar4,'\n');
  std::__cxx11::string::~string(local_1f8);
  std::__cxx11::string::~string(local_1d8);
  lVar7 = local_1a8 * 1000;
  local_200.__r =
       (rep)std::chrono::
            duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                      ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_stack_fffffffffffffc48);
  rVar8 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_200);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,lVar7 / rVar8);
  poVar4 = std::operator<<(poVar4," ops/secs");
  std::operator<<(poVar4,"\n\n");
  if (local_150 != (ulong *)0x0) {
    puVar10 = local_150 + -1;
    puVar12 = local_150 + local_150[-1];
    puVar11 = local_150;
    if (local_150 != puVar12) {
      do {
        puVar12 = puVar12 + -1;
        std::thread::~thread((thread *)0x165111);
      } while (puVar12 != puVar11);
    }
    operator_delete__(puVar10);
  }
  if (local_178 != (ulong *)0x0) {
    in_stack_fffffffffffffc60 =
         (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)(local_178 + -1);
    puVar10 = local_178 + local_178[-1];
    puVar11 = local_178;
    if (local_178 != puVar10) {
      do {
        puVar10 = puVar10 + -1;
        std::thread::~thread((thread *)0x16517e);
      } while (puVar10 != puVar11);
    }
    operator_delete__(in_stack_fffffffffffffc60);
  }
  this = local_40;
  if (local_40 !=
      (Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0> *)0x0) {
    operator_delete__(local_40);
  }
  disruptor::Sequencer<long,_disruptor::SingleThreadedStrategy,_disruptor::BusySpinStrategy,_0>::
  ~Sequencer(this);
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~vector
            (in_stack_fffffffffffffc60);
  return;
}

Assistant:

void runOnce() {
  std::cout << "Staring run " << std::endl;

  sum.store(0);

  disruptor::Sequence* sequences = new disruptor::Sequence[nc];

  std::vector<disruptor::Sequence*> seqs;
  disruptor::Sequencer<T, C, W> s(RING_BUFFER_SIZE);

  for (int i = 0; i < nc; ++i) seqs.push_back(&sequences[i]);

  s.set_gating_sequences(seqs);

  std::thread* tc = new std::thread[nc];
  for (int i = 0; i < nc; ++i)
    tc[i] = std::thread(consume<T, C, W>, std::ref(s), std::ref(sequences[i]));

  std::thread* tp = new std::thread[np];

  auto start_time = std::chrono::high_resolution_clock::now();

  for (int i = 0; i < np; ++i)
    tp[i] = std::thread(produce<T, C, W>, std::ref(s));

  // std::this_thread::sleep_for(std::chrono::seconds(3));

  for (int i = 0; i < np; ++i) tp[i].join();
  for (int i = 0; i < nc; ++i) tc[i].join();

  int64_t cursor = s.GetCursor();
  std::cout << "\nBatch size: " << delta
            << " Ring buffer size: " << RING_BUFFER_SIZE << '\n';
  std::cout << "Cursor: " << cursor << '\n';
  std::cout << "Sum: " << sum.load() << " Expected sum: "
            << (expectedValue * (expectedValue + 1) * nc) / 2 << '\n';

  auto end_time = std::chrono::high_resolution_clock::now();
  auto diff = end_time - start_time;

  //std::cout.precision(15);
  std::cout << np << "P-" << nc << "C " << demangle(typeid(C).name()) << " "
            << demangle(typeid(W).name()) << '\n';
  std::cout << (cursor * 1000) /
                   (std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                        .count())
            << " ops/secs"
            << "\n\n";

  delete[] tc;
  delete[] tp;
  delete[] sequences;
}